

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O3

size_t portability_path_get_relative
                 (char *base,size_t base_size,char *path,size_t path_size,char *relative,
                 size_t relative_size)

{
  ulong uVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  char cVar5;
  ulong uVar6;
  
  if (relative == (char *)0x0 || (path == (char *)0x0 || base == (char *)0x0)) {
    return 0;
  }
  if (base_size < path_size) {
    path_size = base_size;
  }
  cVar5 = *path;
  if (*base == cVar5) {
    uVar6 = 0;
    cVar3 = *base;
    do {
      cVar5 = cVar3;
      uVar1 = uVar6;
      if ((path_size <= uVar6) || (cVar5 == '\0')) break;
      uVar1 = uVar6 + 1;
      lVar2 = uVar6 + 1;
      cVar5 = path[uVar6 + 1];
      uVar6 = uVar1;
      cVar3 = base[lVar2];
    } while (base[lVar2] == cVar5);
  }
  else {
    uVar1 = 0;
  }
  uVar6 = uVar1 + (cVar5 == '/');
  cVar3 = path[uVar6];
  if (uVar6 < relative_size && cVar3 != '\0') {
    lVar4 = 0;
    do {
      lVar2 = lVar4 + 1;
      relative[lVar4] = cVar3;
      if (relative_size <= (cVar5 == '/') + uVar1 + 1 + lVar4) break;
      cVar3 = path[lVar4 + uVar6 + 1];
      lVar4 = lVar2;
    } while (cVar3 != '\0');
  }
  else {
    lVar2 = 0;
  }
  relative[lVar2] = '\0';
  return lVar2 + 1;
}

Assistant:

size_t portability_path_get_relative(const char *base, size_t base_size, const char *path, size_t path_size, char *relative, size_t relative_size)
{
	if (base == NULL || path == NULL || relative == NULL)
	{
		return 0;
	}

	size_t i, length = 0, size = base_size < path_size ? base_size : path_size;

	for (i = 0; base[i] == path[i] && (base[i] != '\0' || path[i] != '\0') && i < size; ++i)
		;

	if (PORTABILITY_PATH_SEPARATOR(path[i]))
	{
		++i;
	}

	for (; path[i] != '\0' && i < relative_size; ++i)
	{
		relative[length++] = path[i];
	}

	relative[length] = '\0';

	return length + 1;
}